

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall crnlib::mipmapped_texture::is_flipped(mipmapped_texture *this)

{
  mip_level **ppmVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  ulong uVar3;
  uint l;
  ulong uVar4;
  uint m;
  ulong uVar5;
  
  uVar3 = (ulong)(this->m_faces).m_size;
  pvVar2 = (this->m_faces).m_p;
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    uVar5 = 0;
    while (pvVar2[uVar4].m_size != uVar5) {
      ppmVar1 = pvVar2[uVar4].m_p + uVar5;
      uVar5 = uVar5 + 1;
      if (((*ppmVar1)->m_orient_flags & (cOrientationFlagYFlipped|cOrientationFlagXFlipped)) !=
          cDefaultOrientationFlags) goto LAB_00123db5;
    }
  }
LAB_00123db5:
  return uVar4 < uVar3;
}

Assistant:

bool mipmapped_texture::is_flipped() const {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (m_faces[l][m]->is_flipped())
        return true;

  return false;
}